

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::MaybeBootstrap
               (Options *options,GeneratorContext *generator_context,bool bootstrap_flag,
               string *basename)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pZVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_348;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_4;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  local_320 [8];
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_3;
  Printer printer_2;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_258;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_2;
  undefined1 local_230 [8];
  Printer printer_1;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_170;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_1;
  undefined1 local_148 [8];
  Printer printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_88;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string forward_to_basename;
  undefined1 local_50 [8];
  string bootstrap_basename;
  string *basename_local;
  bool bootstrap_flag_local;
  GeneratorContext *generator_context_local;
  Options *options_local;
  
  bootstrap_basename.field_2._8_8_ = basename;
  std::__cxx11::string::string((string *)local_50);
  bVar1 = GetBootstrapBasename
                    (options,(string *)bootstrap_basename.field_2._8_8_,(string *)local_50);
  if (bVar1) {
    if (bootstrap_flag) {
      std::__cxx11::string::operator=((string *)bootstrap_basename.field_2._8_8_,(string *)local_50)
      ;
      options_local._7_1_ = false;
    }
    else {
      std::__cxx11::string::string((string *)&output,(string *)local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &printer.annotation_collector_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     bootstrap_basename.field_2._8_8_,".pb.h");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                        (generator_context,&printer.annotation_collector_);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_88,(pointer)CONCAT44(extraout_var,iVar2));
      std::__cxx11::string::~string((string *)&printer.annotation_collector_);
      pZVar3 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get(&local_88);
      io::Printer::Printer((Printer *)local_148,pZVar3,'$',(AnnotationCollector *)0x0);
      FilenameIdentifier((string *)&output_1,(string *)bootstrap_basename.field_2._8_8_);
      io::Printer::Print<char[20],std::__cxx11::string,char[20],std::__cxx11::string>
                ((Printer *)local_148,
                 "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n#include \"$forward_to_basename$.pb.h\"  // IWYU pragma: export\n#endif  // PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n"
                 ,(char (*) [20])"forward_to_basename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                 (char (*) [20])"filename_identifier",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_1);
      std::__cxx11::string::~string((string *)&output_1);
      if (((options->opensource_runtime & 1U) == 0) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)bootstrap_basename.field_2._8_8_,"net/proto/protocoltype"),
         bVar1)) {
        io::Printer::Print<char[20],std::__cxx11::string>
                  ((Printer *)local_148,
                   "#ifdef SWIG\n%include \"$forward_to_basename$.pb.h\"\n#endif  // SWIG\n",
                   (char (*) [20])"forward_to_basename",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output);
      }
      io::Printer::~Printer((Printer *)local_148);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_88);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &printer_1.annotation_collector_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     bootstrap_basename.field_2._8_8_,".proto.h");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                        (generator_context,&printer_1.annotation_collector_);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_170,(pointer)CONCAT44(extraout_var_00,iVar2));
      std::__cxx11::string::~string((string *)&printer_1.annotation_collector_);
      pZVar3 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get(&local_170);
      io::Printer::Printer((Printer *)local_230,pZVar3,'$',(AnnotationCollector *)0x0);
      FilenameIdentifier((string *)&output_2,(string *)bootstrap_basename.field_2._8_8_);
      io::Printer::Print<char[20],std::__cxx11::string,char[20],std::__cxx11::string>
                ((Printer *)local_230,
                 "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n#include \"$forward_to_basename$.proto.h\"  // IWYU pragma: export\n#endif  // PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n"
                 ,(char (*) [20])"forward_to_basename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                 (char (*) [20])"filename_identifier",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_2);
      std::__cxx11::string::~string((string *)&output_2);
      io::Printer::~Printer((Printer *)local_230);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_170);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &printer_2.annotation_collector_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     bootstrap_basename.field_2._8_8_,".pb.cc");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                        (generator_context,&printer_2.annotation_collector_);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_258,(pointer)CONCAT44(extraout_var_01,iVar2));
      std::__cxx11::string::~string((string *)&printer_2.annotation_collector_);
      pZVar3 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get(&local_258);
      io::Printer::Printer((Printer *)&output_3,pZVar3,'$',(AnnotationCollector *)0x0);
      io::Printer::Print<>((Printer *)&output_3,"\n");
      io::Printer::~Printer((Printer *)&output_3);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_258);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     bootstrap_basename.field_2._8_8_,".pb.h.meta");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&output_4);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                (local_320,(pointer)CONCAT44(extraout_var_02,iVar2));
      std::__cxx11::string::~string((string *)&output_4);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     *)local_320);
      std::operator+(&local_368,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     bootstrap_basename.field_2._8_8_,".proto.h.meta");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_368);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_348,(pointer)CONCAT44(extraout_var_03,iVar2));
      std::__cxx11::string::~string((string *)&local_368);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_348);
      options_local._7_1_ = true;
      std::__cxx11::string::~string((string *)&output);
    }
  }
  else {
    options_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_50);
  return options_local._7_1_;
}

Assistant:

bool MaybeBootstrap(const Options& options, GeneratorContext* generator_context,
                    bool bootstrap_flag, std::string* basename) {
  std::string bootstrap_basename;
  if (!GetBootstrapBasename(options, *basename, &bootstrap_basename)) {
    return false;
  }

  if (bootstrap_flag) {
    // Adjust basename, but don't abort code generation.
    *basename = bootstrap_basename;
    return false;
  } else {
    std::string forward_to_basename = bootstrap_basename;

    // Generate forwarding headers and empty .pb.cc.
    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".pb.h"));
      io::Printer printer(output.get(), '$', nullptr);
      printer.Print(
          "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n"
          "#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n"
          "#include \"$forward_to_basename$.pb.h\"  // IWYU pragma: export\n"
          "#endif  // PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n",
          "forward_to_basename", forward_to_basename, "filename_identifier",
          FilenameIdentifier(*basename));

      if (!options.opensource_runtime) {
        // HACK HACK HACK, tech debt from the deeps of proto1 and SWIG
        // protocoltype is SWIG'ed and we need to forward
        if (*basename == "net/proto/protocoltype") {
          printer.Print(
              "#ifdef SWIG\n"
              "%include \"$forward_to_basename$.pb.h\"\n"
              "#endif  // SWIG\n",
              "forward_to_basename", forward_to_basename);
        }
      }
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".proto.h"));
      io::Printer printer(output.get(), '$', nullptr);
      printer.Print(
          "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n"
          "#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n"
          "#include \"$forward_to_basename$.proto.h\"  // IWYU pragma: "
          "export\n"
          "#endif  // "
          "PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n",
          "forward_to_basename", forward_to_basename, "filename_identifier",
          FilenameIdentifier(*basename));
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".pb.cc"));
      io::Printer printer(output.get(), '$', nullptr);
      printer.Print("\n");
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".pb.h.meta"));
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".proto.h.meta"));
    }

    // Abort code generation.
    return true;
  }
}